

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::
proxy_write(connection<websocketpp::config::asio_client::transport_config> *this,
           init_handler *callback)

{
  string *__return_storage_ptr__;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  request *this_01;
  element_type *peVar1;
  timer_handler *callback_00;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *s;
  element_type *peVar2;
  size_t in_RCX;
  undefined1 local_118 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>
  local_d8;
  _Function_base local_90;
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>
  local_70;
  
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00->m_static_channels & 0x400) != 0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,"asio connection proxy_write",in_RCX);
  }
  this_01 = (request *)
            (this->m_proxy_data).
            super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_01 == (request *)0x0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              ((this->m_elog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,2,"assertion failed: !m_proxy_data in asio::connection::proxy_write",in_RCX);
    local_e8._8_8_ = error::get_category();
    local_e8._0_4_ = 1;
    std::function<void_(const_std::error_code_&)>::operator()
              (callback,(error_code *)(local_f8 + 0x10));
  }
  else {
    __return_storage_ptr__ = (string *)(local_f8 + 0x10);
    http::parser::request::raw_abi_cxx11_(__return_storage_ptr__,this_01);
    std::__cxx11::string::operator=
              ((string *)
               ((this->m_proxy_data).
                super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr + 0x1b8),(string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    peVar1 = (this->m_proxy_data).
             super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_e8._0_8_ = *(undefined8 *)(peVar1 + 0x1b8);
    local_e8._8_8_ = *(undefined8 *)(peVar1 + 0x1c0);
    std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>::
    emplace_back<boost::asio::const_buffer>(&this->m_bufs,(const_buffer *)(local_f8 + 0x10));
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,
               (this->m_proxy_data).
               super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr + 0x1b8,in_RCX);
    callback_00 = *(timer_handler **)
                   ((this->m_proxy_data).
                    super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x238);
    local_118._0_8_ = handle_proxy_timeout;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    get_shared((connection<websocketpp::config::asio_client::transport_config> *)local_f8);
    std::
    _Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,std::error_code_const&)>
    ::
    _Bind<std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>&,std::_Placeholder<1>const&>
              ((_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,std::error_code_const&)>
                *)(local_f8 + 0x10),
               (offset_in_connection<websocketpp::config::asio_client::transport_config>_to_subr *)
               local_118,
               (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
                *)local_f8,callback,(_Placeholder<1> *)&std::placeholders::_1);
    std::function<void(std::error_code_const&)>::
    function<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,std::error_code_const&)>,void>
              ((function<void(std::error_code_const&)> *)&local_90,
               (_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>
                *)(local_f8 + 0x10));
    set_timer((connection<websocketpp::config::asio_client::transport_config> *)(local_118 + 0x10),
              (long)this,callback_00);
    std::
    __shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)((this->m_proxy_data).
                    super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x240),
                (__shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)(local_118 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
    std::_Function_base::~_Function_base(&local_90);
    std::
    _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
                    *)(local_e8 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    s = (this->super_socket_con_type).m_socket.
        super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr;
    peVar2 = (this->m_strand).
             super___shared_ptr<boost::asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_118._16_8_ = handle_proxy_write;
    local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    get_shared((connection<websocketpp::config::asio_client::transport_config> *)local_118);
    std::
    _Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,boost::system::error_code_const&)>
    ::
    _Bind<std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>&,std::_Placeholder<1>const&>
              ((_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,boost::system::error_code_const&)>
                *)&local_70,
               (offset_in_connection<websocketpp::config::asio_client::transport_config>_to_subr *)
               (local_118 + 0x10),
               (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
                *)local_118,callback,(_Placeholder<1> *)&std::placeholders::_1);
    local_e8._0_8_ = peVar2->service_;
    local_e8._8_8_ = peVar2->impl_;
    std::
    _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>
    ::_Bind((_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>
             *)(local_e8 + 0x10),&local_70);
    boost::asio::
    async_write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,std::vector<boost::asio::const_buffer,std::allocator<boost::asio::const_buffer>>,boost::asio::detail::wrapped_handler<boost::asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,boost::system::error_code_const&)>,boost::asio::detail::is_continuation_if_running>>
              (s,&this->m_bufs,
               (wrapped_handler<boost::asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>,_boost::asio::detail::is_continuation_if_running>
                *)(local_f8 + 0x10),(type *)0x0);
    std::
    _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
                    *)(local_e8 + 0x20));
    std::
    _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
    ::~_Tuple_impl(&local_70._M_bound_args.
                    super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>_>
                  );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
  }
  return;
}

Assistant:

void proxy_write(init_handler callback) {
        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection proxy_write");
        }

        if (!m_proxy_data) {
            m_elog->write(log::elevel::library,
                "assertion failed: !m_proxy_data in asio::connection::proxy_write");
            callback(make_error_code(error::general));
            return;
        }

        m_proxy_data->write_buf = m_proxy_data->req.raw();

        m_bufs.push_back(lib::asio::buffer(m_proxy_data->write_buf.data(),
                                           m_proxy_data->write_buf.size()));

        m_alog->write(log::alevel::devel,m_proxy_data->write_buf);

        // Set a timer so we don't wait forever for the proxy to respond
        m_proxy_data->timer = this->set_timer(
            m_proxy_data->timeout_proxy,
            lib::bind(
                &type::handle_proxy_timeout,
                get_shared(),
                callback,
                lib::placeholders::_1
            )
        );

        // Send proxy request
        if (config::enable_multithreading) {
            lib::asio::async_write(
                socket_con_type::get_next_layer(),
                m_bufs,
                m_strand->wrap(lib::bind(
                    &type::handle_proxy_write, get_shared(),
                    callback,
                    lib::placeholders::_1
                ))
            );
        } else {
            lib::asio::async_write(
                socket_con_type::get_next_layer(),
                m_bufs,
                lib::bind(
                    &type::handle_proxy_write, get_shared(),
                    callback,
                    lib::placeholders::_1
                )
            );
        }
    }